

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::ActivationParametricSoftplus::ByteSizeLong
          (ActivationParametricSoftplus *this)

{
  size_t sVar1;
  size_t sVar2;
  
  if (this->alpha_ == (WeightParams *)0x0 ||
      this == (ActivationParametricSoftplus *)&_ActivationParametricSoftplus_default_instance_) {
    sVar1 = 0;
  }
  else {
    sVar1 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>(this->alpha_);
    sVar1 = sVar1 + 1;
  }
  if (this->beta_ != (WeightParams *)0x0 &&
      this != (ActivationParametricSoftplus *)&_ActivationParametricSoftplus_default_instance_) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>(this->beta_);
    sVar1 = sVar1 + sVar2 + 1;
  }
  this->_cached_size_ = (int)sVar1;
  return sVar1;
}

Assistant:

size_t ActivationParametricSoftplus::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ActivationParametricSoftplus)
  size_t total_size = 0;

  // .CoreML.Specification.WeightParams alpha = 1;
  if (this->has_alpha()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->alpha_);
  }

  // .CoreML.Specification.WeightParams beta = 2;
  if (this->has_beta()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->beta_);
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}